

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::Combo(char *label,int *current_item,char *items_separated_by_zeros,int height_in_items)

{
  bool bVar1;
  size_t sVar2;
  char *pcStack_30;
  bool value_changed;
  char *p;
  int items_count;
  int height_in_items_local;
  char *items_separated_by_zeros_local;
  int *current_item_local;
  char *label_local;
  
  p._0_4_ = 0;
  for (pcStack_30 = items_separated_by_zeros; *pcStack_30 != '\0';
      pcStack_30 = pcStack_30 + sVar2 + 1) {
    sVar2 = strlen(pcStack_30);
    p._0_4_ = (int)p + 1;
  }
  bVar1 = Combo(label,current_item,Items_SingleStringGetter,items_separated_by_zeros,(int)p,
                height_in_items);
  return bVar1;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* items_separated_by_zeros, int height_in_items)
{
    int items_count = 0;
    const char* p = items_separated_by_zeros;       // FIXME-OPT: Avoid computing this, or at least only when combo is open
    while (*p)
    {
        p += strlen(p) + 1;
        items_count++;
    }
    bool value_changed = Combo(label, current_item, Items_SingleStringGetter, (void*)items_separated_by_zeros, items_count, height_in_items);
    return value_changed;
}